

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O3

void __thiscall bitfoot::Bitfoot::GenerateMoves<true>(Bitfoot *this)

{
  ulong uVar1;
  uint64_t uVar2;
  
  uVar2 = this->positionKey;
  if ((uVar2 == 0) || (uVar2 != this->movegenKey)) {
    this->movegenKey = uVar2;
    this->moveStage = 1;
    this->moveCount = 0;
    this->moveIndex = 0;
    this->sortIndex = 0;
  }
  else {
    this->moveIndex = 0;
    if (this->moveStage != 1) {
      if (this->moveStage != 3) {
        __assert_fail("moveStage == PromosAndCaptures",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0xe7f,"void bitfoot::Bitfoot::GenerateMoves() [color = true]");
      }
      goto LAB_0010ad0a;
    }
  }
  if (this->moveCount != 0) {
    __assert_fail("moveCount == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xe80,"void bitfoot::Bitfoot::GenerateMoves() [color = true]");
  }
  if (this->sortIndex != 0) {
    __assert_fail("sortIndex == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xe82,"void bitfoot::Bitfoot::GenerateMoves() [color = true]");
  }
  uVar1 = this->chkrs;
  if (uVar1 == 0) {
    GetPromosAndCaptures<true,true>(this);
    AddCastleMoves<true>(this);
    AddPawnPushes<true,true>(this,~(this->pc[1] | this->pc[0]) & 0xffffffffffffff00);
    AddKnightMoves<true>(this,~(this->pc[1] | this->pc[0]));
    AddBishopMoves<true>(this,~(this->pc[1] | this->pc[0]));
    AddQueenMoves<true>(this,~(this->pc[1] | this->pc[0]));
    AddRookMoves<true>(this,~(this->pc[1] | this->pc[0]));
    uVar2 = ~(this->pc[1] | this->pc[0]);
LAB_0010acfb:
    AddKingMoves<true>(this,uVar2);
  }
  else {
    if ((uVar1 & uVar1 - 1) != 0) {
      uVar2 = 0xffffffffffffffff;
      goto LAB_0010acfb;
    }
    GetCheckEvasions<true>(this);
  }
  this->moveStage = 3;
LAB_0010ad0a:
  this->moveIndex = 0;
  this->sortIndex = 0;
  return;
}

Assistant:

inline void GenerateMoves() {
    InitMovegen(AllMoves);
    if (moveStage != Finished) {
      assert(moveStage == PromosAndCaptures);
      assert(moveCount == 0);
      assert(moveIndex == 0);
      assert(sortIndex == 0);
      if (chkrs) {
        if (MULTI_BIT(chkrs)) {
          AddKingMoves<color>(_ALL);
        }
        else {
          GetCheckEvasions<color>();
        }
      }
      else {
        GetPromosAndCaptures<color, true>(); // under_promote=true
        GetQuietMoves<color>();
      }
      moveStage = Finished;
    }
    moveIndex = sortIndex = 0;
  }